

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_list.hpp
# Opt level: O2

TestSuite *
iutest::detail::FindList<iutest::TestSuite*,iutest::TestSuite::FindOp>
          (vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_> *list,FindOp *f)

{
  pointer ppTVar1;
  bool bVar2;
  pointer ppTVar3;
  
  ppTVar3 = (list->super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (list->super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppTVar3 == ppTVar1) {
      return (TestSuite *)0x0;
    }
    bVar2 = TestSuite::FindOp::operator()(f,*ppTVar3);
    if (bVar2) break;
    ppTVar3 = ppTVar3 + 1;
  }
  return *ppTVar3;
}

Assistant:

T FindList(const ::std::vector<T>& list, Fn& f)
{
    for(typename ::std::vector<T>::const_iterator it = list.begin(), end = list.end(); it != end; ++it)
    {
        if(f(*it))
        {
            return *it;
        }
    }
    return NULL;
}